

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86.cpp
# Opt level: O0

int __thiscall ncnn::ReLU_x86::forward_inplace_int8(ReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long lVar2;
  int iVar3;
  long *in_RSI;
  long *in_RDI;
  int i_1;
  char *ptr_1;
  int q_1;
  int i;
  char *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  int local_28c;
  char *local_240;
  int local_234;
  int local_230;
  char *local_1d8;
  int local_1cc;
  
  lVar2 = in_RSI[7];
  iVar3 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
  if ((int)in_RSI[3] == 8) {
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      for (local_1cc = 0; local_1cc < (int)lVar2; local_1cc = local_1cc + 1) {
        local_1d8 = (char *)(*in_RSI + in_RSI[8] * (long)local_1cc * in_RSI[2]);
        for (local_230 = 0; local_230 < iVar3; local_230 = local_230 + 1) {
          if (*local_1d8 < '\0') {
            *local_1d8 = '\0';
          }
          if (local_1d8[1] < '\0') {
            local_1d8[1] = '\0';
          }
          if (local_1d8[2] < '\0') {
            local_1d8[2] = '\0';
          }
          if (local_1d8[3] < '\0') {
            local_1d8[3] = '\0';
          }
          if (local_1d8[4] < '\0') {
            local_1d8[4] = '\0';
          }
          if (local_1d8[5] < '\0') {
            local_1d8[5] = '\0';
          }
          if (local_1d8[6] < '\0') {
            local_1d8[6] = '\0';
          }
          if (local_1d8[7] < '\0') {
            local_1d8[7] = '\0';
          }
          local_1d8 = local_1d8 + 8;
        }
      }
    }
  }
  else {
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      for (local_234 = 0; local_234 < (int)lVar2; local_234 = local_234 + 1) {
        local_240 = (char *)(*in_RSI + in_RSI[8] * (long)local_234 * in_RSI[2]);
        for (local_28c = 0; local_28c < iVar3; local_28c = local_28c + 1) {
          if (*local_240 < '\0') {
            *local_240 = '\0';
          }
          local_240 = local_240 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int ReLU_x86::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
    int elempack = bottom_top_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                signed char* ptr = bottom_top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    if (ptr[0] < 0)
                        ptr[0] = 0;
                    if (ptr[1] < 0)
                        ptr[1] = 0;
                    if (ptr[2] < 0)
                        ptr[2] = 0;
                    if (ptr[3] < 0)
                        ptr[3] = 0;
                    if (ptr[4] < 0)
                        ptr[4] = 0;
                    if (ptr[5] < 0)
                        ptr[5] = 0;
                    if (ptr[6] < 0)
                        ptr[6] = 0;
                    if (ptr[7] < 0)
                        ptr[7] = 0;

                    ptr += 8;
                }
            }
        }
        else
        {
            // TODO leakyrelu
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            int i = 0;
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr = 0;

                ptr++;
            }
        }
    }
    else
    {
        // TODO leakyrelu
    }

    return 0;
}